

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::RuleBasedCollator
          (RuleBasedCollator *this,UnicodeString *rules,ECollationStrength strength,
          UErrorCode *errorCode)

{
  UErrorCode *errorCode_local;
  ECollationStrength strength_local;
  UnicodeString *rules_local;
  RuleBasedCollator *this_local;
  
  Collator::Collator(&this->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_0049c600;
  this->data = (CollationData *)0x0;
  this->settings = (CollationSettings *)0x0;
  this->tailoring = (CollationTailoring *)0x0;
  this->cacheEntry = (CollationCacheEntry *)0x0;
  Locale::Locale(&this->validLocale,"",(char *)0x0,(char *)0x0,(char *)0x0);
  this->explicitlySetAttributes = 0;
  this->actualLocaleIsSameAsValid = '\0';
  internalBuildTailoring
            (this,rules,strength,UCOL_DEFAULT,(UParseError *)0x0,(UnicodeString *)0x0,errorCode);
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator(const UnicodeString &rules, ECollationStrength strength,
                                     UErrorCode &errorCode)
        : data(NULL),
          settings(NULL),
          tailoring(NULL),
          cacheEntry(NULL),
          validLocale(""),
          explicitlySetAttributes(0),
          actualLocaleIsSameAsValid(FALSE) {
    internalBuildTailoring(rules, strength, UCOL_DEFAULT, NULL, NULL, errorCode);
}